

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

void __thiscall caffe::ArgMaxParameter::SharedCtor(ArgMaxParameter *this)

{
  this->_cached_size_ = 0;
  this->out_max_val_ = false;
  *(undefined3 *)&this->field_0x19 = 0;
  this->axis_ = 0;
  this->top_k_ = 1;
  return;
}

Assistant:

void ArgMaxParameter::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&out_max_val_, 0, reinterpret_cast<char*>(&axis_) -
    reinterpret_cast<char*>(&out_max_val_) + sizeof(axis_));
  top_k_ = 1u;
}